

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatUpdateLoop<duckdb::BitState<unsigned_char>,signed_char,duckdb::BitOrOperation>
               (char *idata,AggregateInputData *aggr_input_data,BitState<unsigned_char> *state,
               idx_t count,ValidityMask *mask)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  byte bVar8;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  uVar6 = 0;
  uVar5 = 0;
  do {
    if (uVar5 == count + 0x3f >> 6) {
      return;
    }
    if (puVar1 == (unsigned_long *)0x0) {
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
LAB_005a0f1e:
      for (; uVar3 = uVar6, uVar6 < uVar7; uVar6 = uVar6 + 1) {
        bVar8 = idata[uVar6];
        if (state->is_set == false) {
          state->is_set = true;
        }
        else {
          bVar8 = bVar8 | state->value;
        }
        state->value = bVar8;
      }
    }
    else {
      uVar2 = puVar1[uVar5];
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
      if (uVar2 == 0xffffffffffffffff) goto LAB_005a0f1e;
      uVar3 = uVar7;
      if (uVar2 != 0) {
        uVar4 = 0;
        for (; uVar3 = uVar6, uVar6 < uVar7; uVar6 = uVar6 + 1) {
          if ((uVar2 >> (uVar4 & 0x3f) & 1) != 0) {
            if (state->is_set == false) {
              state->value = idata[uVar6];
              state->is_set = true;
            }
            else {
              state->value = state->value | idata[uVar6];
            }
          }
          uVar4 = uVar4 + 1;
        }
      }
    }
    uVar6 = uVar3;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static inline void NullaryScatterLoop(STATE_TYPE **__restrict states, AggregateInputData &aggr_input_data,
	                                      const SelectionVector &ssel, idx_t count) {

		for (idx_t i = 0; i < count; i++) {
			auto sidx = ssel.get_index(i);
			OP::template Operation<STATE_TYPE, OP>(*states[sidx], aggr_input_data, sidx);
		}
	}